

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

size_t bssl::anon_unknown_0::GetClientHelloLen
                 (uint16_t max_version,uint16_t session_version,size_t ticket_len)

{
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  pointer psVar3;
  SSL *pSVar4;
  SSL_SESSION *session_00;
  pointer psVar5;
  size_type sVar6;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> client_hello;
  UniquePtr<SSL> ssl;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_30;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL_CTX> ctx;
  size_t ticket_len_local;
  uint16_t session_version_local;
  size_t sStack_10;
  uint16_t max_version_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar3 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&session,psVar3);
  CreateSessionWithTicket((anon_unknown_0 *)&local_30,session_version,ticket_len);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&session);
  if ((!bVar1) || (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30), !bVar1))
  {
    sStack_10 = 0;
    goto LAB_0017cb9d;
  }
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&session);
  pSVar4 = SSL_new((SSL_CTX *)psVar3);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)
             &client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(pointer)pSVar4);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)
                     &client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                               &client_hello.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    session_00 = (SSL_SESSION *)
                 std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_30);
    iVar2 = SSL_set_session(pSVar4,session_00);
    if (iVar2 == 0) goto LAB_0017cac3;
    psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                        &client_hello.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    iVar2 = SSL_set_strict_cipher_list(psVar5,"ECDHE-RSA-AES128-GCM-SHA256");
    if (iVar2 == 0) goto LAB_0017cac3;
    psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                        &client_hello.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    iVar2 = SSL_set_max_proto_version(psVar5,max_version);
    if (iVar2 == 0) goto LAB_0017cac3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                        &client_hello.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    bVar1 = GetClientHello(psVar5,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60)
    ;
    if ((bVar1) &&
       (sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60),
       5 < sVar6)) {
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
      sStack_10 = sVar6 - 5;
    }
    else {
      sStack_10 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  }
  else {
LAB_0017cac3:
    sStack_10 = 0;
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
             &client_hello.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
LAB_0017cb9d:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&session);
  return sStack_10;
}

Assistant:

static size_t GetClientHelloLen(uint16_t max_version, uint16_t session_version,
                                size_t ticket_len) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  bssl::UniquePtr<SSL_SESSION> session =
      CreateSessionWithTicket(session_version, ticket_len);
  if (!ctx || !session) {
    return 0;
  }

  // Set a one-element cipher list so the baseline ClientHello is unpadded.
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  if (!ssl || !SSL_set_session(ssl.get(), session.get()) ||
      !SSL_set_strict_cipher_list(ssl.get(), "ECDHE-RSA-AES128-GCM-SHA256") ||
      !SSL_set_max_proto_version(ssl.get(), max_version)) {
    return 0;
  }

  std::vector<uint8_t> client_hello;
  if (!GetClientHello(ssl.get(), &client_hello) ||
      client_hello.size() <= SSL3_RT_HEADER_LENGTH) {
    return 0;
  }

  return client_hello.size() - SSL3_RT_HEADER_LENGTH;
}